

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sigmund~.c
# Opt level: O3

void sigmund_tweak(int npts,t_float *ftreal,t_float *ftimag,int npeak,t_peak_conflict *peaks,
                  t_float fperbin,int loud)

{
  float fVar1;
  uint *puVar2;
  float *pfVar3;
  bool bVar4;
  long lVar5;
  byte bVar6;
  float fVar7;
  int iVar8;
  int iVar9;
  ulong __nmemb;
  long lVar10;
  ulong uVar11;
  uint uVar12;
  long *plVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  float fVar24;
  undefined8 uStack_170;
  uint local_168 [2];
  t_peak_conflict negpeak;
  float local_68 [2];
  t_float ampreal [3];
  t_float ampimag [3];
  
  uVar12 = npeak + 1;
  lVar5 = -((long)(int)uVar12 * 8 + 0xfU & 0xfffffffffffffff0);
  plVar13 = (long *)((long)local_168 + lVar5);
  if (0 < npeak) {
    fVar7 = (float)npts;
    __nmemb = (ulong)(uint)npeak;
    lVar10 = __nmemb - 1;
    auVar21._8_4_ = (int)lVar10;
    auVar21._0_8_ = lVar10;
    auVar21._12_4_ = (int)((ulong)lVar10 >> 0x20);
    uVar11 = 0;
    do {
      auVar22._8_4_ = (int)uVar11;
      auVar22._0_8_ = uVar11;
      auVar22._12_4_ = (int)(uVar11 >> 0x20);
      auVar22 = (auVar22 | _DAT_001b5390) ^ _DAT_001b53a0;
      bVar4 = SUB164(auVar21 ^ _DAT_001b53a0,0) < auVar22._0_4_;
      iVar8 = SUB164(auVar21 ^ _DAT_001b53a0,4);
      iVar9 = auVar22._4_4_;
      if ((bool)(~(iVar8 < iVar9 || iVar9 == iVar8 && bVar4) & 1)) {
        *(t_peak_conflict **)((long)&negpeak + uVar11 * 8 + lVar5) = peaks;
      }
      if (iVar8 >= iVar9 && (iVar9 != iVar8 || !bVar4)) {
        *(t_peak_conflict **)((long)&negpeak + uVar11 * 8 + lVar5 + 8) = peaks + 1;
      }
      uVar11 = uVar11 + 2;
      peaks = peaks + 2;
    } while ((uVar12 & 0xfffffffe) != uVar11);
    *(undefined8 *)((long)&uStack_170 + lVar5) = 0x1b37ca;
    qsort((void *)((long)&negpeak + lVar5),__nmemb,8,sigmund_cmp_freq);
    *plVar13 = (long)local_168;
    puVar2 = *(uint **)((long)&negpeak + lVar5);
    negpeak.p_freq = (t_float)puVar2[2];
    negpeak.p_amp = -(float)puVar2[3];
    local_168[0] = *puVar2 ^ 0x80000000;
    uVar11 = 1;
    do {
      iVar8 = (int)(*(float *)plVar13[uVar11] * (1.0 / fperbin) + 0.5);
      if ((-1 < iVar8) && (iVar8 <= npts * 2 + -3)) {
        lVar10 = 0;
        do {
          iVar9 = (int)lVar10 + iVar8 + -2;
          *(t_float *)((long)local_68 + lVar10 * 2) = ftreal[iVar9];
          *(t_float *)((long)ampreal + lVar10 * 2 + 4) = ftimag[iVar9];
          lVar10 = lVar10 + 2;
        } while (lVar10 != 6);
        bVar6 = 1;
        lVar10 = 0;
        do {
          pfVar3 = *(float **)((long)&uStack_170 + lVar10 + uVar11 * 8 + lVar5);
          fVar17 = pfVar3[2] * (float)npts;
          fVar18 = pfVar3[3] * (float)npts;
          negpeak.p_salience = -fVar18;
          negpeak.p_tmp = -0.0;
          lVar10 = 0;
          do {
            fVar1 = (*pfVar3 * -(1.0 / fperbin) + (float)((int)lVar10 + iVar8 + -2)) * 1.5707964;
            *(undefined8 *)((long)&uStack_170 + lVar5) = 0x1b395a;
            dVar14 = sin((double)fVar1);
            dVar15 = (double)(((fVar7 + -0.5) / fVar7) * fVar1);
            *(undefined8 *)((long)&uStack_170 + lVar5) = 0x1b3993;
            dVar16 = cos(dVar15);
            *(undefined8 *)((long)&uStack_170 + lVar5) = 0x1b39a5;
            dVar15 = sin(dVar15);
            fVar19 = -1.0;
            if (0.003 <= ABS(fVar1)) {
              fVar19 = -(float)dVar14 / fVar1;
            }
            fVar1 = *(float *)((long)ampreal + lVar10 * 2 + 4);
            *(float *)((long)local_68 + lVar10 * 2) =
                 ((float)dVar16 * fVar17 + negpeak.p_salience * (float)dVar15) * fVar19 +
                 *(float *)((long)local_68 + lVar10 * 2);
            *(float *)((long)ampreal + lVar10 * 2 + 4) =
                 ((float)dVar15 * fVar17 + fVar18 * (float)dVar16) * fVar19 + fVar1;
            lVar10 = lVar10 + 2;
          } while (lVar10 != 6);
          lVar10 = 0x10;
          bVar4 = (bool)(uVar11 != __nmemb & bVar6);
          bVar6 = 0;
        } while (bVar4);
        fVar17 = local_68[1] * 0.5 + (local_68[0] + ampreal[0]) * -0.25;
        fVar1 = ampreal[2] * 0.5 + (ampreal[1] + ampimag[0]) * -0.25;
        fVar24 = fVar17 * fVar17 + fVar1 * fVar1;
        fVar18 = ((ampreal[2] - (ampreal[1] + ampimag[0]) * 0.5) * (ampreal[1] - ampimag[0]) * 0.5 +
                 (local_68[1] - (local_68[0] + ampreal[0]) * 0.5) * (local_68[0] - ampreal[0]) * 0.5
                 ) / (fVar24 * 4.0);
        fVar19 = 0.5;
        if ((fVar18 <= 0.5) && (fVar19 = fVar18, fVar18 < -0.5)) {
          fVar19 = -0.5;
        }
        fVar18 = fVar19 * 3.1415927;
        dVar14 = (double)fVar18;
        *(undefined8 *)((long)&uStack_170 + lVar5) = 0x1b3bbd;
        dVar15 = sin(dVar14);
        *(undefined8 *)((long)&uStack_170 + lVar5) = 0x1b3bce;
        dVar16 = cos(dVar14);
        pfVar3 = (float *)plVar13[uVar11];
        *pfVar3 = (fVar19 + fVar19 + (float)iVar8) * fperbin;
        fVar19 = (float)dVar15;
        auVar20._4_4_ = fVar19;
        auVar20._0_4_ = fVar19;
        auVar20._8_4_ = fVar19;
        auVar20._12_4_ = fVar19;
        auVar23._0_4_ = (float)(dVar14 + 3.141592653589793);
        auVar23._4_4_ = (float)(dVar14 + -3.141592653589793);
        auVar23._8_8_ = 0;
        auVar21 = divps(auVar20,auVar23);
        fVar18 = (1.0 / (float)((double)(-(ulong)(ABS(fVar18) < 0.003) & 0x3ff0000000000000 |
                                        ~-(ulong)(ABS(fVar18) < 0.003) &
                                        (ulong)(double)(fVar19 / fVar18)) * 0.5 +
                               (double)((float)(-(uint)(ABS(auVar23._4_4_) < 0.003) & 0x3f800000 |
                                               ~-(uint)(ABS(auVar23._4_4_) < 0.003) & auVar21._4_4_)
                                       + (float)(-(uint)(ABS(auVar23._0_4_) < 0.003) & 0x3f800000 |
                                                ~-(uint)(ABS(auVar23._0_4_) < 0.003) & auVar21._0_4_
                                                )) * -0.25)) * (1.0 / fVar7);
        pfVar3[1] = fVar18 * SQRT(fVar24);
        pfVar3[2] = fVar18 * (fVar17 * (float)dVar16 + fVar19 * -fVar1);
        pfVar3[3] = fVar18 * (fVar17 * fVar19 + (float)dVar16 * fVar1);
      }
      uVar11 = uVar11 + 1;
    } while (uVar11 != uVar12);
  }
  return;
}

Assistant:

static void sigmund_tweak(int npts, t_float *ftreal, t_float *ftimag,
    int npeak, t_peak *peaks, t_float fperbin, int loud)
{
    t_peak **peakptrs = (t_peak **)alloca(sizeof (*peakptrs) * (npeak+1));
    t_peak negpeak;
    int peaki, j, k;
    t_float ampreal[3], ampimag[3];
    t_float binperf = 1./fperbin;
    t_float phaseperbin = (npts-0.5)/npts, oneovern = 1./npts;
    if (npeak < 1)
        return;
    for (peaki = 0; peaki < npeak; peaki++)
        peakptrs[peaki+1] = &peaks[peaki];
    qsort(peakptrs+1, npeak, sizeof (*peakptrs), sigmund_cmp_freq);
    peakptrs[0] = &negpeak;
    negpeak.p_ampreal = peakptrs[1]->p_ampreal;
    negpeak.p_ampimag = -peakptrs[1]->p_ampimag;
    negpeak.p_freq = -peakptrs[1]->p_freq;
    for (peaki = 1; peaki <= npeak; peaki++)
    {
        int cbin = peakptrs[peaki]->p_freq*binperf + 0.5;
        int nsub = (peaki == npeak ? 1:2);
        t_float windreal, windimag, windpower, detune, pidetune, sinpidetune,
            cospidetune, ampcorrect, ampout, ampoutreal, ampoutimag, freqout;
        /* post("3 nsub %d amp %f freq %f", nsub,
            peakptrs[peaki]->p_amp, peakptrs[peaki]->p_freq); */
        if (cbin < 0 || cbin > 2*npts - 3)
            continue;
        for (j = 0; j < 3; j++)
            ampreal[j] = ftreal[cbin+2*j-2], ampimag[j] = ftimag[cbin+2*j-2];
        /* post("a %f %f", ampreal[1], ampimag[1]); */
        for (j = 0; j < nsub; j++)
        {
            t_peak *neighbor = peakptrs[(peaki-1) + 2*j];
            t_float neighborreal = npts * neighbor->p_ampreal;
            t_float neighborimag = npts * neighbor->p_ampimag;
            for (k = 0; k < 3; k++)
            {
                t_float freqdiff = (0.5*PI) * ((cbin + 2*k-2)
                    -binperf * neighbor->p_freq);
                t_float sx = sinx(freqdiff, sin(freqdiff));
                t_float phasere = cos(freqdiff * phaseperbin);
                t_float phaseim = sin(freqdiff * phaseperbin);
                ampreal[k] -=
                    sx * (phasere * neighborreal - phaseim * neighborimag);
                ampimag[k] -=
                    sx * (phaseim * neighborreal + phasere * neighborimag);
            }       
            /* post("b %f %f", ampreal[1], ampimag[1]); */
        }

        windreal = W_ALPHA * ampreal[1] -
            (0.5 * W_BETA) * (ampreal[0] + ampreal[2]);
        windimag = W_ALPHA * ampimag[1] -
            (0.5 * W_BETA) * (ampimag[0] + ampimag[2]);
        windpower = windreal * windreal + windimag * windimag;
        detune = (
            W_BETA*(ampreal[0] - ampreal[2]) * 
                (2.0*W_ALPHA * ampreal[1] - W_BETA * (ampreal[0] + ampreal[2]))
                    +
            W_BETA*(ampimag[0] - ampimag[2]) *
                (2.0*W_ALPHA * ampimag[1] - W_BETA * (ampimag[0] + ampimag[2]))
                        ) / (4.0 * windpower);
        if (detune > 0.5)
            detune = 0.5;
        else if (detune < -0.5)
            detune = -0.5;
        /* if (loud > 0)
            post("tweak: windpower %f, bin %d, detune %f",
                windpower, cbin, detune); */
        pidetune = PI * detune;
        sinpidetune = sin(pidetune);
        cospidetune = cos(pidetune);

        ampcorrect = 1.0 / window_hann_mag(pidetune, sinpidetune);

        ampout = oneovern * ampcorrect *sqrt(windpower);
        ampoutreal = oneovern * ampcorrect *
            (windreal * cospidetune - windimag * sinpidetune);
        ampoutimag = oneovern * ampcorrect *
            (windreal * sinpidetune + windimag * cospidetune);
        freqout = (cbin + 2*detune) * fperbin;
        /* if (loud > 1)
            post("amp %f, freq %f", ampout, freqout); */
        
        peakptrs[peaki]->p_freq = freqout;
        peakptrs[peaki]->p_amp = ampout;
        peakptrs[peaki]->p_ampreal = ampoutreal;
        peakptrs[peaki]->p_ampimag = ampoutimag;
    }
}